

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginTooltipHidden(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool ret;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_0000043c;
  bool *in_stack_00000440;
  char *in_stack_00000448;
  
  pIVar1 = GImGui;
  bVar2 = Begin(in_stack_00000448,in_stack_00000440,in_stack_0000043c);
  SetWindowHiddenAndSkipItemsForCurrentFrame(pIVar1->CurrentWindow);
  return bVar2;
}

Assistant:

bool ImGui::BeginTooltipHidden()
{
    ImGuiContext& g = *GImGui;
    bool ret = Begin("##Tooltip_Hidden", NULL, ImGuiWindowFlags_Tooltip | ImGuiWindowFlags_NoInputs | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_AlwaysAutoResize);
    SetWindowHiddenAndSkipItemsForCurrentFrame(g.CurrentWindow);
    return ret;
}